

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::queryObjectState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLuint handle,
               QueriedState *state)

{
  bool bVar1;
  QueriedState local_58;
  GLboolean local_29;
  QueriedState *pQStack_28;
  GLboolean value;
  QueriedState *state_local;
  GLuint handle_local;
  QueryType type_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  if (type == QUERY_ISTEXTURE) {
    pQStack_28 = state;
    state_local._0_4_ = handle;
    state_local._4_4_ = type;
    _handle_local = gl;
    gl_local = (CallLogWrapper *)result;
    local_29 = glu::CallLogWrapper::glIsTexture(gl,handle);
    bVar1 = checkError((ResultCollector *)gl_local,_handle_local,"glIsTexture");
    if ((bVar1) && (bVar1 = verifyBooleanValidity((ResultCollector *)gl_local,local_29), bVar1)) {
      QueriedState::QueriedState(&local_58,local_29 == '\x01');
      memcpy(pQStack_28,&local_58,0x28);
    }
  }
  return;
}

Assistant:

void queryObjectState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLuint handle, QueriedState& state)
{
	switch (type)
	{
		case QUERY_ISTEXTURE:
		{
			const glw::GLboolean value = gl.glIsTexture(handle);

			if (!checkError(result, gl, "glIsTexture"))
				return;

			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}
		default:
			DE_ASSERT(false);
	}
}